

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMTLIB2.cpp
# Opt level: O0

void __thiscall Parse::SMTLIB2::readBenchmark(SMTLIB2 *this,LExprList *bench)

{
  bool bVar1;
  byte bVar2;
  Mode MVar3;
  LExpr *pLVar4;
  DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
  *pDVar5;
  undefined8 uVar6;
  ostream *this_00;
  byte *in_RDI;
  LispListReader ibRdr_1;
  string *name_5;
  LExpr *exp;
  Iterator lIt;
  LExprList *lel;
  string symbol;
  LExpr *body_5;
  LExpr *body_4;
  LExpr *body_3;
  LExpr *body_2;
  LExprList *definitions;
  LExprList *declarations;
  LExpr *body_1;
  LExpr *oSort_2;
  TermStack typeArgs;
  TermLookup *lookup_2;
  LispListReader iArgRdr;
  LExprList *iArgs;
  string name_4;
  bool recursive;
  LispListReader oSortRdr;
  TermLookup *lookup_1;
  LExpr *oSort_1;
  string name_3;
  LExprList *datatypes_1;
  LExprList *sorts_1;
  LExprList *datatypes;
  LExprList *sorts;
  LExprList *datatype;
  LExpr *sort;
  LExpr *oSort;
  TermLookup *lookup;
  LispListReader iSortRdr;
  LExprList *iSorts;
  string name_2;
  LExpr *body;
  LExprList *args;
  string name_1;
  string arity;
  string name;
  LispListReader ibRdr;
  LExpr *lexp;
  bool afterCheckSat;
  LispListReader bRdr;
  uint in_stack_ffffffffffffeaa8;
  undefined4 in_stack_ffffffffffffeaac;
  UserErrorException *in_stack_ffffffffffffeab0;
  undefined7 in_stack_ffffffffffffeab8;
  undefined1 in_stack_ffffffffffffeabf;
  Stack<Kernel::TermList> *in_stack_ffffffffffffeac0;
  undefined7 in_stack_ffffffffffffeac8;
  byte in_stack_ffffffffffffeacf;
  undefined7 in_stack_ffffffffffffeae0;
  byte in_stack_ffffffffffffeae7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeae8;
  undefined7 in_stack_ffffffffffffeaf0;
  byte in_stack_ffffffffffffeaf7;
  LExpr *in_stack_ffffffffffffeaf8;
  undefined7 in_stack_ffffffffffffeb00;
  byte in_stack_ffffffffffffeb07;
  LispListReader *in_stack_ffffffffffffeb08;
  byte in_stack_ffffffffffffeb17;
  Expression *in_stack_ffffffffffffeb18;
  undefined7 in_stack_ffffffffffffeb58;
  byte in_stack_ffffffffffffeb5f;
  SMTLIB2 *in_stack_ffffffffffffeb60;
  undefined8 in_stack_ffffffffffffeb90;
  undefined7 in_stack_ffffffffffffeb98;
  byte in_stack_ffffffffffffeb9f;
  LExprList *in_stack_ffffffffffffeba0;
  string *in_stack_ffffffffffffeba8;
  SMTLIB2 *in_stack_ffffffffffffebb0;
  undefined7 in_stack_ffffffffffffebd8;
  byte in_stack_ffffffffffffebdf;
  LExprList *in_stack_ffffffffffffebe0;
  string *in_stack_ffffffffffffebe8;
  SMTLIB2 *in_stack_ffffffffffffebf0;
  LExpr *in_stack_ffffffffffffec28;
  SMTLIB2 *in_stack_ffffffffffffec30;
  string *in_stack_ffffffffffffec48;
  SMTLIB2 *in_stack_ffffffffffffec50;
  undefined7 in_stack_ffffffffffffec78;
  undefined1 in_stack_ffffffffffffec7f;
  SMTLIB2 *in_stack_ffffffffffffec80;
  undefined7 in_stack_ffffffffffffec88;
  undefined1 in_stack_ffffffffffffec8f;
  SMTLIB2 *in_stack_ffffffffffffec90;
  bool local_1342;
  string *in_stack_ffffffffffffed80;
  LExpr *in_stack_ffffffffffffed88;
  undefined4 in_stack_ffffffffffffed90;
  uint in_stack_ffffffffffffed94;
  undefined6 in_stack_ffffffffffffee68;
  undefined1 in_stack_ffffffffffffee6e;
  TermLookup *lookup_00;
  undefined7 in_stack_ffffffffffffee78;
  byte in_stack_ffffffffffffee7f;
  SMTLIB2 *in_stack_ffffffffffffee80;
  undefined1 local_1121 [40];
  allocator<char> local_10f9;
  string local_10f8 [47];
  undefined1 local_10c9;
  undefined1 local_1001 [40];
  undefined1 local_fd9 [33];
  string *local_fb8;
  Expression *local_fb0;
  Iterator local_fa8;
  LExprList *local_fa0;
  undefined8 local_f91;
  undefined1 local_f69 [40];
  allocator<char> local_f41;
  string local_f40 [23];
  undefined1 in_stack_fffffffffffff0d7;
  TermStack *in_stack_fffffffffffff0d8;
  LExpr *in_stack_fffffffffffff0e0;
  LExpr *in_stack_fffffffffffff0e8;
  LExprList *in_stack_fffffffffffff0f0;
  string *in_stack_fffffffffffff0f8;
  SMTLIB2 *in_stack_fffffffffffff100;
  allocator<char> local_ef1;
  string local_ef0 [16];
  LExprList *in_stack_fffffffffffff120;
  LExpr *in_stack_fffffffffffff128;
  undefined7 in_stack_fffffffffffff130;
  undefined1 in_stack_fffffffffffff137;
  allocator<char> local_de1;
  string local_de0 [39];
  allocator<char> local_db9;
  string local_db8 [32];
  string local_d98 [39];
  allocator<char> local_d71;
  string local_d70 [32];
  LExpr *local_d50;
  undefined1 local_d41;
  undefined1 in_stack_fffffffffffff2cf;
  LExprList *in_stack_fffffffffffff2d0;
  LExprList *in_stack_fffffffffffff2d8;
  SMTLIB2 *in_stack_fffffffffffff2e0;
  undefined1 local_c91 [33];
  LExpr *local_c70;
  undefined1 local_c61;
  LExprList *in_stack_fffffffffffff420;
  LExprList *in_stack_fffffffffffff428;
  SMTLIB2 *in_stack_fffffffffffff430;
  allocator<char> local_bb1;
  string local_bb0 [32];
  LExpr *local_b90;
  undefined1 local_b81;
  undefined1 local_ad1 [33];
  LExpr *local_ab0;
  undefined1 local_aa1;
  allocator<char> local_9f1;
  string local_9f0 [32];
  LExprList *local_9d0;
  LExprList *local_9c8;
  allocator<char> local_9b9;
  string local_9b8 [32];
  LExpr *local_998;
  undefined1 local_989;
  LExpr *local_8e0;
  undefined1 local_8d1;
  string local_828 [64];
  SMTLIB2 *local_7e8;
  undefined8 local_7e0;
  LExprList *local_7d8;
  string local_7d0 [37];
  byte local_7ab;
  byte local_7aa;
  allocator<char> local_7a9;
  string local_7a8 [39];
  allocator<char> local_781;
  string local_780 [39];
  byte local_759;
  string local_758 [32];
  undefined8 local_738;
  DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
  *local_730;
  LExpr *local_728;
  undefined1 local_719;
  string local_670 [39];
  allocator<char> local_649;
  string local_648 [32];
  LExprList *local_628;
  LExprList *local_620;
  allocator<char> local_611;
  string local_610 [32];
  LExprList *local_5f0;
  LExprList *local_5e8;
  allocator<char> local_5d9;
  string local_5d8 [32];
  LExprList *local_5b8;
  LExpr *local_5b0;
  allocator<char> local_5a1;
  string local_5a0 [32];
  LExpr *local_580;
  undefined1 local_571;
  string local_4c8 [32];
  DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
  *local_4a8;
  undefined8 local_4a0;
  string *local_498;
  string local_490 [39];
  allocator<char> local_469;
  string local_468 [32];
  LExpr *local_448;
  undefined1 local_439;
  LExprList *local_390;
  string local_388 [39];
  allocator<char> local_361;
  string local_360 [39];
  undefined1 local_339;
  string local_298 [32];
  string local_278 [39];
  undefined1 local_251 [33];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [39];
  undefined1 local_1c9 [33];
  string local_1a8 [39];
  allocator<char> local_181;
  string local_180 [39];
  allocator<char> local_159;
  string local_158 [32];
  string local_138 [39];
  undefined1 local_111;
  allocator<char> local_51;
  string local_50 [32];
  undefined8 local_30;
  LExpr *local_28;
  byte local_19;
  
  Shell::LispListReader::LispListReader
            ((LispListReader *)in_stack_ffffffffffffeab0,
             (LExprList *)CONCAT44(in_stack_ffffffffffffeaac,in_stack_ffffffffffffeaa8));
  local_19 = 0;
LAB_00a47244:
  do {
    bVar1 = Shell::LispListReader::hasNext((LispListReader *)0xa47251);
    if (!bVar1) {
LAB_00a4b480:
      if ((local_19 & 1) != 0) {
        while (bVar1 = Shell::LispListReader::hasNext((LispListReader *)0xa4b49d), bVar1) {
          Shell::LispListReader::next((LispListReader *)0xa4b4b3);
          Shell::LispListReader::LispListReader
                    ((LispListReader *)CONCAT17(in_stack_ffffffffffffeb07,in_stack_ffffffffffffeb00)
                     ,in_stack_ffffffffffffeaf8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0),
                     (char *)in_stack_ffffffffffffeae8,
                     (allocator<char> *)
                     CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0));
          in_stack_ffffffffffffeacf =
               Shell::LispListReader::tryAcceptAtom
                         ((LispListReader *)
                          CONCAT17(in_stack_ffffffffffffeacf,in_stack_ffffffffffffeac8),
                          (string *)in_stack_ffffffffffffeac0);
          std::__cxx11::string::~string(local_10f8);
          std::allocator<char>::~allocator(&local_10f9);
          if ((in_stack_ffffffffffffeacf & 1) != 0) {
            Shell::LispListReader::acceptEOL
                      ((LispListReader *)
                       CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
            Shell::LispListReader::acceptEOL
                      ((LispListReader *)
                       CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
            return;
          }
          in_stack_ffffffffffffeac0 = (Stack<Kernel::TermList> *)local_1121;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0),
                     (char *)in_stack_ffffffffffffeae8,
                     (allocator<char> *)
                     CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0));
          bVar2 = Shell::LispListReader::tryAcceptAtom
                            ((LispListReader *)
                             CONCAT17(in_stack_ffffffffffffeacf,in_stack_ffffffffffffeac8),
                             (string *)in_stack_ffffffffffffeac0);
          std::__cxx11::string::~string((string *)(local_1121 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_1121);
          if ((bVar2 & 1) == 0) {
            MVar3 = Shell::Options::mode(Lib::env);
            if (MVar3 == SPIDER) {
              return;
            }
            this_00 = std::operator<<((ostream *)&std::cout,
                                      "% Warning: check-sat is not the last entry. Skipping the rest!"
                                     );
            std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
            return;
          }
          Shell::Options::setOutputMode(Lib::env,UCORE);
          Shell::LispListReader::acceptEOL
                    ((LispListReader *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0)
                    );
        }
      }
      return;
    }
    local_28 = Shell::LispListReader::next((LispListReader *)0xa47267);
    *(LExpr **)(in_RDI + 0x118) = local_28;
    in_RDI[0xa0] = 0;
    in_RDI[0xa1] = 0;
    in_RDI[0xa2] = 0;
    in_RDI[0xa3] = 0;
    Shell::LispListReader::LispListReader
              ((LispListReader *)CONCAT17(in_stack_ffffffffffffeb07,in_stack_ffffffffffffeb00),
               in_stack_ffffffffffffeaf8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0),
               (char *)in_stack_ffffffffffffeae8,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0));
    bVar1 = Shell::LispListReader::tryAcceptAtom
                      ((LispListReader *)
                       CONCAT17(in_stack_ffffffffffffeacf,in_stack_ffffffffffffeac8),
                       (string *)in_stack_ffffffffffffeac0);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator(&local_51);
    if (bVar1) {
      if ((*in_RDI & 1) != 0) {
        local_111 = 1;
        uVar6 = __cxa_allocate_exception(0x50);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0),
                   (char *)in_stack_ffffffffffffeae8,
                   (allocator<char> *)CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0))
        ;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_ffffffffffffeabf,in_stack_ffffffffffffeab8),
                       (char *)in_stack_ffffffffffffeab0);
        Shell::LispParser::Expression::toString_abi_cxx11_
                  (in_stack_ffffffffffffeb18,(bool)in_stack_ffffffffffffeb17);
        std::operator+(in_stack_ffffffffffffeae8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_ffffffffffffeabf,in_stack_ffffffffffffeab8),
                       (char *)in_stack_ffffffffffffeab0);
        Lib::UserErrorException::Exception
                  (in_stack_ffffffffffffeab0,
                   (string *)CONCAT44(in_stack_ffffffffffffeaac,in_stack_ffffffffffffeaa8));
        local_111 = 0;
        __cxa_throw(uVar6,&Lib::UserErrorException::typeinfo,
                    Lib::UserErrorException::~UserErrorException);
      }
      Shell::LispListReader::readAtom_abi_cxx11_(in_stack_ffffffffffffeb08);
      readLogic(in_stack_ffffffffffffec50,in_stack_ffffffffffffec48);
      std::__cxx11::string::~string(local_138);
      Shell::LispListReader::acceptEOL
                ((LispListReader *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
      goto LAB_00a47244;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0),
               (char *)in_stack_ffffffffffffeae8,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0));
    bVar1 = Shell::LispListReader::tryAcceptAtom
                      ((LispListReader *)
                       CONCAT17(in_stack_ffffffffffffeacf,in_stack_ffffffffffffeac8),
                       (string *)in_stack_ffffffffffffeac0);
    std::__cxx11::string::~string(local_158);
    std::allocator<char>::~allocator(&local_159);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0),
                 (char *)in_stack_ffffffffffffeae8,
                 (allocator<char> *)CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0));
      bVar1 = Shell::LispListReader::tryAcceptAtom
                        ((LispListReader *)
                         CONCAT17(in_stack_ffffffffffffeacf,in_stack_ffffffffffffeac8),
                         (string *)in_stack_ffffffffffffeac0);
      std::__cxx11::string::~string(local_180);
      std::allocator<char>::~allocator(&local_181);
      if (bVar1) {
        Shell::LispListReader::readAtom_abi_cxx11_(in_stack_ffffffffffffeb08);
        std::__cxx11::string::operator=((string *)(in_RDI + 0x10),local_1a8);
        std::__cxx11::string::~string(local_1a8);
        Shell::LispListReader::acceptEOL
                  ((LispListReader *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
      }
      else {
        in_stack_ffffffffffffee80 = (SMTLIB2 *)local_1c9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0),
                   (char *)in_stack_ffffffffffffeae8,
                   (allocator<char> *)CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0))
        ;
        in_stack_ffffffffffffee7f =
             Shell::LispListReader::tryAcceptAtom
                       ((LispListReader *)
                        CONCAT17(in_stack_ffffffffffffeacf,in_stack_ffffffffffffeac8),
                        (string *)in_stack_ffffffffffffeac0);
        std::__cxx11::string::~string((string *)(local_1c9 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_1c9);
        if ((in_stack_ffffffffffffee7f & 1) == 0) {
          Shell::LispListReader::readAtom_abi_cxx11_(in_stack_ffffffffffffeb08);
          std::__cxx11::string::~string(local_210);
          Shell::LispListReader::readAtom_abi_cxx11_(in_stack_ffffffffffffeb08);
          std::__cxx11::string::~string(local_230);
          Shell::LispListReader::acceptEOL
                    ((LispListReader *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0)
                    );
        }
        else {
          Shell::LispListReader::readAtom_abi_cxx11_(in_stack_ffffffffffffeb08);
          std::__cxx11::string::operator=((string *)(in_RDI + 0x30),local_1f0);
          std::__cxx11::string::~string(local_1f0);
          Shell::LispListReader::acceptEOL
                    ((LispListReader *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0)
                    );
        }
      }
    }
    else {
      lookup_00 = (TermLookup *)local_251;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0),
                 (char *)in_stack_ffffffffffffeae8,
                 (allocator<char> *)CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0));
      bVar2 = Shell::LispListReader::tryAcceptAtom
                        ((LispListReader *)
                         CONCAT17(in_stack_ffffffffffffeacf,in_stack_ffffffffffffeac8),
                         (string *)in_stack_ffffffffffffeac0);
      std::__cxx11::string::~string((string *)(local_251 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_251);
      if ((bVar2 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0),
                   (char *)in_stack_ffffffffffffeae8,
                   (allocator<char> *)CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0))
        ;
        bVar1 = Shell::LispListReader::tryAcceptAtom
                          ((LispListReader *)
                           CONCAT17(in_stack_ffffffffffffeacf,in_stack_ffffffffffffeac8),
                           (string *)in_stack_ffffffffffffeac0);
        std::__cxx11::string::~string(local_360);
        std::allocator<char>::~allocator(&local_361);
        if (bVar1) {
          Shell::LispListReader::readAtom_abi_cxx11_(in_stack_ffffffffffffeb08);
          local_390 = Shell::LispListReader::readList((LispListReader *)0xa47d58);
          bVar1 = Shell::LispListReader::hasNext((LispListReader *)0xa47d7f);
          if (!bVar1) {
            local_439 = 1;
            uVar6 = __cxa_allocate_exception(0x50);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0),
                       (char *)in_stack_ffffffffffffeae8,
                       (allocator<char> *)
                       CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0));
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_ffffffffffffeabf,in_stack_ffffffffffffeab8),
                           (char *)in_stack_ffffffffffffeab0);
            Shell::LispParser::Expression::toString_abi_cxx11_
                      (in_stack_ffffffffffffeb18,(bool)in_stack_ffffffffffffeb17);
            std::operator+(in_stack_ffffffffffffeae8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0));
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_ffffffffffffeabf,in_stack_ffffffffffffeab8),
                           (char *)in_stack_ffffffffffffeab0);
            Lib::UserErrorException::Exception
                      (in_stack_ffffffffffffeab0,
                       (string *)CONCAT44(in_stack_ffffffffffffeaac,in_stack_ffffffffffffeaa8));
            local_439 = 0;
            __cxa_throw(uVar6,&Lib::UserErrorException::typeinfo,
                        Lib::UserErrorException::~UserErrorException);
          }
          local_448 = Shell::LispListReader::readNext((LispListReader *)0xa48003);
          readDefineSort(in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8,
                         in_stack_ffffffffffffebe0,
                         (LExpr *)CONCAT17(in_stack_ffffffffffffebdf,in_stack_ffffffffffffebd8));
          Shell::LispListReader::acceptEOL
                    ((LispListReader *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0)
                    );
          std::__cxx11::string::~string(local_388);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0),
                     (char *)in_stack_ffffffffffffeae8,
                     (allocator<char> *)
                     CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0));
          bVar1 = Shell::LispListReader::tryAcceptAtom
                            ((LispListReader *)
                             CONCAT17(in_stack_ffffffffffffeacf,in_stack_ffffffffffffeac8),
                             (string *)in_stack_ffffffffffffeac0);
          std::__cxx11::string::~string(local_468);
          std::allocator<char>::~allocator(&local_469);
          if (bVar1) {
            Shell::LispListReader::readAtom_abi_cxx11_(in_stack_ffffffffffffeb08);
            local_498 = (string *)Shell::LispListReader::readList((LispListReader *)0xa4811c);
            Shell::LispListReader::LispListReader
                      ((LispListReader *)in_stack_ffffffffffffeab0,
                       (LExprList *)CONCAT44(in_stack_ffffffffffffeaac,in_stack_ffffffffffffeaa8));
            pDVar5 = (DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
                      *)Lib::
                        DHMap<std::__cxx11::string,std::pair<Kernel::TermList,Kernel::TermList>,Lib::DefaultHash,Lib::DefaultHash2>
                        ::operator_new(0xa48157);
            Lib::
            DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
            ::DHMap(pDVar5);
            local_4a8 = pDVar5;
            Lib::
            Stack<Lib::DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>_*>
            ::push((Stack<Lib::DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>_*>
                    *)in_stack_ffffffffffffeab0,
                   (DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
                    *)CONCAT44(in_stack_ffffffffffffeaac,in_stack_ffffffffffffeaa8));
            bVar1 = Shell::LispListReader::hasNext((LispListReader *)0xa481ab);
            if (bVar1) {
              pLVar4 = Shell::LispListReader::peekAtNext((LispListReader *)0xa481d1);
              bVar1 = Shell::LispParser::Expression::isAtom(pLVar4);
              if (bVar1) {
                Shell::LispListReader::peekAtNext((LispListReader *)0xa4820e);
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_stack_ffffffffffffeab0,
                                        (char *)CONCAT44(in_stack_ffffffffffffeaac,
                                                         in_stack_ffffffffffffeaa8));
                if (bVar1) {
                  Shell::LispListReader::acceptEOL
                            ((LispListReader *)
                             CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
                  Shell::LispListReader::readAtom_abi_cxx11_(in_stack_ffffffffffffeb08);
                  std::__cxx11::string::~string(local_4c8);
                  readTypeParameters(in_stack_ffffffffffffee80,
                                     (LispListReader *)
                                     CONCAT17(in_stack_ffffffffffffee7f,in_stack_ffffffffffffee78),
                                     lookup_00,
                                     (TermStack *)
                                     CONCAT17(bVar2,CONCAT16(in_stack_ffffffffffffee6e,
                                                             in_stack_ffffffffffffee68)));
                  local_498 = (string *)Shell::LispListReader::readList((LispListReader *)0xa482ac);
                  local_30 = local_4a0;
                }
              }
            }
            bVar1 = Shell::LispListReader::hasNext((LispListReader *)0xa48375);
            if (!bVar1) {
              local_571 = 1;
              uVar6 = __cxa_allocate_exception(0x50);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0),
                         (char *)in_stack_ffffffffffffeae8,
                         (allocator<char> *)
                         CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0));
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_ffffffffffffeabf,in_stack_ffffffffffffeab8),
                             (char *)in_stack_ffffffffffffeab0);
              Shell::LispParser::Expression::toString_abi_cxx11_
                        (in_stack_ffffffffffffeb18,(bool)in_stack_ffffffffffffeb17);
              std::operator+(in_stack_ffffffffffffeae8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0));
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_ffffffffffffeabf,in_stack_ffffffffffffeab8),
                             (char *)in_stack_ffffffffffffeab0);
              Lib::UserErrorException::Exception
                        (in_stack_ffffffffffffeab0,
                         (string *)CONCAT44(in_stack_ffffffffffffeaac,in_stack_ffffffffffffeaa8));
              local_571 = 0;
              __cxa_throw(uVar6,&Lib::UserErrorException::typeinfo,
                          Lib::UserErrorException::~UserErrorException);
            }
            in_stack_ffffffffffffed88 = Shell::LispListReader::readNext((LispListReader *)0xa4859a);
            in_stack_ffffffffffffed80 = local_498;
            local_580 = in_stack_ffffffffffffed88;
            in_stack_ffffffffffffed94 =
                 Lib::
                 DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
                 ::size(local_4a8);
            readDeclareFun(in_stack_ffffffffffffebb0,in_stack_ffffffffffffeba8,
                           in_stack_ffffffffffffeba0,
                           (LExpr *)CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),
                           (uint)((ulong)in_stack_ffffffffffffeb90 >> 0x20));
            Shell::LispListReader::acceptEOL
                      ((LispListReader *)
                       CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
            pDVar5 = Lib::
                     Stack<Lib::DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>_*>
                     ::pop((Stack<Lib::DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>_*>
                            *)(in_RDI + 0xa8));
            if (pDVar5 != (DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
                           *)0x0) {
              Lib::
              DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
              ::~DHMap((DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
                        *)in_stack_ffffffffffffeab0);
              Lib::
              DHMap<std::__cxx11::string,std::pair<Kernel::TermList,Kernel::TermList>,Lib::DefaultHash,Lib::DefaultHash2>
              ::operator_delete(in_stack_ffffffffffffeab0,
                                CONCAT44(in_stack_ffffffffffffeaac,in_stack_ffffffffffffeaa8));
            }
            std::__cxx11::string::~string(local_490);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0),
                       (char *)in_stack_ffffffffffffeae8,
                       (allocator<char> *)
                       CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0));
            bVar1 = Shell::LispListReader::tryAcceptAtom
                              ((LispListReader *)
                               CONCAT17(in_stack_ffffffffffffeacf,in_stack_ffffffffffffeac8),
                               (string *)in_stack_ffffffffffffeac0);
            std::__cxx11::string::~string(local_5a0);
            std::allocator<char>::~allocator(&local_5a1);
            if (bVar1) {
              local_5b0 = Shell::LispListReader::readNext((LispListReader *)0xa4871f);
              local_5b8 = Shell::LispListReader::readList((LispListReader *)0xa48734);
              readDeclareDatatype((SMTLIB2 *)
                                  CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
                                  in_stack_fffffffffffff128,in_stack_fffffffffffff120);
              Shell::LispListReader::acceptEOL
                        ((LispListReader *)
                         CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0),
                         (char *)in_stack_ffffffffffffeae8,
                         (allocator<char> *)
                         CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0));
              bVar1 = Shell::LispListReader::tryAcceptAtom
                                ((LispListReader *)
                                 CONCAT17(in_stack_ffffffffffffeacf,in_stack_ffffffffffffeac8),
                                 (string *)in_stack_ffffffffffffeac0);
              std::__cxx11::string::~string(local_5d8);
              std::allocator<char>::~allocator(&local_5d9);
              if (bVar1) {
                local_5e8 = Shell::LispListReader::readList((LispListReader *)0xa4883c);
                local_5f0 = Shell::LispListReader::readList((LispListReader *)0xa48851);
                readDeclareDatatypes
                          (in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8,
                           in_stack_fffffffffffff2d0,(bool)in_stack_fffffffffffff2cf);
                Shell::LispListReader::acceptEOL
                          ((LispListReader *)
                           CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0),
                           (char *)in_stack_ffffffffffffeae8,
                           (allocator<char> *)
                           CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0));
                bVar1 = Shell::LispListReader::tryAcceptAtom
                                  ((LispListReader *)
                                   CONCAT17(in_stack_ffffffffffffeacf,in_stack_ffffffffffffeac8),
                                   (string *)in_stack_ffffffffffffeac0);
                std::__cxx11::string::~string(local_610);
                std::allocator<char>::~allocator(&local_611);
                if (bVar1) {
                  local_620 = Shell::LispListReader::readList((LispListReader *)0xa4895b);
                  local_628 = Shell::LispListReader::readList((LispListReader *)0xa48970);
                  readDeclareDatatypes
                            (in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8,
                             in_stack_fffffffffffff2d0,(bool)in_stack_fffffffffffff2cf);
                  Shell::LispListReader::acceptEOL
                            ((LispListReader *)
                             CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0),
                             (char *)in_stack_ffffffffffffeae8,
                             (allocator<char> *)
                             CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0));
                  bVar1 = Shell::LispListReader::tryAcceptAtom
                                    ((LispListReader *)
                                     CONCAT17(in_stack_ffffffffffffeacf,in_stack_ffffffffffffeac8),
                                     (string *)in_stack_ffffffffffffeac0);
                  std::__cxx11::string::~string(local_648);
                  std::allocator<char>::~allocator(&local_649);
                  if (bVar1) {
                    Shell::LispListReader::readAtom_abi_cxx11_(in_stack_ffffffffffffeb08);
                    bVar1 = Shell::LispListReader::hasNext((LispListReader *)0xa48a9a);
                    if (!bVar1) {
                      local_719 = 1;
                      uVar6 = __cxa_allocate_exception(0x50);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0),
                                 (char *)in_stack_ffffffffffffeae8,
                                 (allocator<char> *)
                                 CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0));
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT17(in_stack_ffffffffffffeabf,in_stack_ffffffffffffeab8
                                                ),(char *)in_stack_ffffffffffffeab0);
                      Shell::LispParser::Expression::toString_abi_cxx11_
                                (in_stack_ffffffffffffeb18,(bool)in_stack_ffffffffffffeb17);
                      std::operator+(in_stack_ffffffffffffeae8,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0
                                                ));
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT17(in_stack_ffffffffffffeabf,in_stack_ffffffffffffeab8
                                                ),(char *)in_stack_ffffffffffffeab0);
                      Lib::UserErrorException::Exception
                                (in_stack_ffffffffffffeab0,
                                 (string *)
                                 CONCAT44(in_stack_ffffffffffffeaac,in_stack_ffffffffffffeaa8));
                      local_719 = 0;
                      __cxa_throw(uVar6,&Lib::UserErrorException::typeinfo,
                                  Lib::UserErrorException::~UserErrorException);
                    }
                    local_728 = Shell::LispListReader::readNext((LispListReader *)0xa48d21);
                    pDVar5 = (DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
                              *)Lib::
                                DHMap<std::__cxx11::string,std::pair<Kernel::TermList,Kernel::TermList>,Lib::DefaultHash,Lib::DefaultHash2>
                                ::operator_new(0xa48d45);
                    Lib::
                    DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
                    ::DHMap(pDVar5);
                    local_730 = pDVar5;
                    Lib::
                    Stack<Lib::DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>_*>
                    ::push((Stack<Lib::DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>_*>
                            *)in_stack_ffffffffffffeab0,
                           (DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
                            *)CONCAT44(in_stack_ffffffffffffeaac,in_stack_ffffffffffffeaa8));
                    bVar1 = Shell::LispParser::Expression::isList(local_728);
                    if (bVar1) {
                      Shell::LispListReader::LispListReader
                                ((LispListReader *)
                                 CONCAT17(in_stack_ffffffffffffeb07,in_stack_ffffffffffffeb00),
                                 in_stack_ffffffffffffeaf8);
                      bVar1 = Shell::LispListReader::hasNext((LispListReader *)0xa48dd6);
                      if (bVar1) {
                        pLVar4 = Shell::LispListReader::peekAtNext((LispListReader *)0xa48dfc);
                        bVar1 = Shell::LispParser::Expression::isAtom(pLVar4);
                        if (bVar1) {
                          Shell::LispListReader::peekAtNext((LispListReader *)0xa48e39);
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffeab0,
                                                  (char *)CONCAT44(in_stack_ffffffffffffeaac,
                                                                   in_stack_ffffffffffffeaa8));
                          if (bVar1) {
                            Shell::LispListReader::acceptEOL
                                      ((LispListReader *)
                                       CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0)
                                      );
                            Shell::LispListReader::readAtom_abi_cxx11_(in_stack_ffffffffffffeb08);
                            std::__cxx11::string::~string(local_758);
                            readTypeParameters(in_stack_ffffffffffffee80,
                                               (LispListReader *)
                                               CONCAT17(in_stack_ffffffffffffee7f,
                                                        in_stack_ffffffffffffee78),lookup_00,
                                               (TermStack *)
                                               CONCAT17(bVar2,CONCAT16(in_stack_ffffffffffffee6e,
                                                                       in_stack_ffffffffffffee68)));
                            local_728 = Shell::LispListReader::readNext((LispListReader *)0xa48ed7);
                            local_30 = local_738;
                          }
                        }
                      }
                    }
                    Lib::
                    DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
                    ::size(local_730);
                    readDeclareFun(in_stack_ffffffffffffebb0,in_stack_ffffffffffffeba8,
                                   in_stack_ffffffffffffeba0,
                                   (LExpr *)CONCAT17(in_stack_ffffffffffffeb9f,
                                                     in_stack_ffffffffffffeb98),
                                   (uint)((ulong)in_stack_ffffffffffffeb90 >> 0x20));
                    Shell::LispListReader::acceptEOL
                              ((LispListReader *)
                               CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
                    pDVar5 = Lib::
                             Stack<Lib::DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>_*>
                             ::pop((Stack<Lib::DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>_*>
                                    *)(in_RDI + 0xa8));
                    if (pDVar5 != (DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
                                   *)0x0) {
                      Lib::
                      DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
                      ::~DHMap((DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
                                *)in_stack_ffffffffffffeab0);
                      Lib::
                      DHMap<std::__cxx11::string,std::pair<Kernel::TermList,Kernel::TermList>,Lib::DefaultHash,Lib::DefaultHash2>
                      ::operator_delete(in_stack_ffffffffffffeab0,
                                        CONCAT44(in_stack_ffffffffffffeaac,in_stack_ffffffffffffeaa8
                                                ));
                    }
                    std::__cxx11::string::~string(local_670);
                  }
                  else {
                    local_759 = 0;
                    std::allocator<char>::allocator();
                    local_7aa = 0;
                    local_7ab = 0;
                    std::__cxx11::string::string<std::allocator<char>>
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0),
                               (char *)in_stack_ffffffffffffeae8,
                               (allocator<char> *)
                               CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0));
                    bVar1 = Shell::LispListReader::tryAcceptAtom
                                      ((LispListReader *)
                                       CONCAT17(in_stack_ffffffffffffeacf,in_stack_ffffffffffffeac8)
                                       ,(string *)in_stack_ffffffffffffeac0);
                    local_1342 = true;
                    if (!bVar1) {
                      std::allocator<char>::allocator();
                      local_7aa = 1;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0),
                                 (char *)in_stack_ffffffffffffeae8,
                                 (allocator<char> *)
                                 CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0));
                      local_7ab = 1;
                      local_1342 = Shell::LispListReader::tryAcceptAtom
                                             ((LispListReader *)
                                              CONCAT17(in_stack_ffffffffffffeacf,
                                                       in_stack_ffffffffffffeac8),
                                              (string *)in_stack_ffffffffffffeac0);
                      local_759 = local_1342;
                    }
                    if ((local_7ab & 1) != 0) {
                      std::__cxx11::string::~string(local_7a8);
                    }
                    if ((local_7aa & 1) != 0) {
                      std::allocator<char>::~allocator(&local_7a9);
                    }
                    std::__cxx11::string::~string(local_780);
                    std::allocator<char>::~allocator(&local_781);
                    if (local_1342 == false) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0),
                                 (char *)in_stack_ffffffffffffeae8,
                                 (allocator<char> *)
                                 CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0));
                      bVar1 = Shell::LispListReader::tryAcceptAtom
                                        ((LispListReader *)
                                         CONCAT17(in_stack_ffffffffffffeacf,
                                                  in_stack_ffffffffffffeac8),
                                         (string *)in_stack_ffffffffffffeac0);
                      std::__cxx11::string::~string(local_9b8);
                      std::allocator<char>::~allocator(&local_9b9);
                      if (bVar1) {
                        local_9c8 = Shell::LispListReader::readList((LispListReader *)0xa49a6e);
                        local_9d0 = Shell::LispListReader::readList((LispListReader *)0xa49a83);
                        readDefineFunsRec(in_stack_fffffffffffff430,in_stack_fffffffffffff428,
                                          in_stack_fffffffffffff420);
                      }
                      else {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0),
                                   (char *)in_stack_ffffffffffffeae8,
                                   (allocator<char> *)
                                   CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0));
                        bVar1 = Shell::LispListReader::tryAcceptAtom
                                          ((LispListReader *)
                                           CONCAT17(in_stack_ffffffffffffeacf,
                                                    in_stack_ffffffffffffeac8),
                                           (string *)in_stack_ffffffffffffeac0);
                        std::__cxx11::string::~string(local_9f0);
                        std::allocator<char>::~allocator(&local_9f1);
                        if (bVar1) {
                          bVar1 = Shell::LispListReader::hasNext((LispListReader *)0xa49b7e);
                          if (!bVar1) {
                            local_aa1 = 1;
                            uVar6 = __cxa_allocate_exception(0x50);
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT17(in_stack_ffffffffffffeaf7,
                                                   in_stack_ffffffffffffeaf0),
                                       (char *)in_stack_ffffffffffffeae8,
                                       (allocator<char> *)
                                       CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0)
                                      );
                            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)CONCAT17(in_stack_ffffffffffffeabf,
                                                       in_stack_ffffffffffffeab8),
                                           (char *)in_stack_ffffffffffffeab0);
                            Shell::LispParser::Expression::toString_abi_cxx11_
                                      (in_stack_ffffffffffffeb18,(bool)in_stack_ffffffffffffeb17);
                            std::operator+(in_stack_ffffffffffffeae8,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)CONCAT17(in_stack_ffffffffffffeae7,
                                                       in_stack_ffffffffffffeae0));
                            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)CONCAT17(in_stack_ffffffffffffeabf,
                                                       in_stack_ffffffffffffeab8),
                                           (char *)in_stack_ffffffffffffeab0);
                            Lib::UserErrorException::Exception
                                      (in_stack_ffffffffffffeab0,
                                       (string *)
                                       CONCAT44(in_stack_ffffffffffffeaac,in_stack_ffffffffffffeaa8)
                                      );
                            local_aa1 = 0;
                            __cxa_throw(uVar6,&Lib::UserErrorException::typeinfo,
                                        Lib::UserErrorException::~UserErrorException);
                          }
                          local_ab0 = Shell::LispListReader::readNext((LispListReader *)0xa49dda);
                          readAssert(in_stack_ffffffffffffec30,in_stack_ffffffffffffec28);
                          Shell::LispListReader::acceptEOL
                                    ((LispListReader *)
                                     CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
                        }
                        else {
                          in_stack_ffffffffffffebe0 = (LExprList *)local_ad1;
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0
                                                ),(char *)in_stack_ffffffffffffeae8,
                                     (allocator<char> *)
                                     CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0));
                          in_stack_ffffffffffffebdf =
                               Shell::LispListReader::tryAcceptAtom
                                         ((LispListReader *)
                                          CONCAT17(in_stack_ffffffffffffeacf,
                                                   in_stack_ffffffffffffeac8),
                                          (string *)in_stack_ffffffffffffeac0);
                          std::__cxx11::string::~string((string *)(local_ad1 + 1));
                          std::allocator<char>::~allocator((allocator<char> *)local_ad1);
                          if ((in_stack_ffffffffffffebdf & 1) == 0) {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT17(in_stack_ffffffffffffeaf7,
                                                   in_stack_ffffffffffffeaf0),
                                       (char *)in_stack_ffffffffffffeae8,
                                       (allocator<char> *)
                                       CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0)
                                      );
                            bVar1 = Shell::LispListReader::tryAcceptAtom
                                              ((LispListReader *)
                                               CONCAT17(in_stack_ffffffffffffeacf,
                                                        in_stack_ffffffffffffeac8),
                                               (string *)in_stack_ffffffffffffeac0);
                            std::__cxx11::string::~string(local_bb0);
                            std::allocator<char>::~allocator(&local_bb1);
                            if (bVar1) {
                              bVar1 = Shell::LispListReader::hasNext((LispListReader *)0xa4a1a4);
                              if (!bVar1) {
                                local_c61 = 1;
                                uVar6 = __cxa_allocate_exception(0x50);
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)CONCAT17(in_stack_ffffffffffffeaf7,
                                                       in_stack_ffffffffffffeaf0),
                                           (char *)in_stack_ffffffffffffeae8,
                                           (allocator<char> *)
                                           CONCAT17(in_stack_ffffffffffffeae7,
                                                    in_stack_ffffffffffffeae0));
                                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)CONCAT17(in_stack_ffffffffffffeabf,
                                                           in_stack_ffffffffffffeab8),
                                               (char *)in_stack_ffffffffffffeab0);
                                Shell::LispParser::Expression::toString_abi_cxx11_
                                          (in_stack_ffffffffffffeb18,(bool)in_stack_ffffffffffffeb17
                                          );
                                std::operator+(in_stack_ffffffffffffeae8,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)CONCAT17(in_stack_ffffffffffffeae7,
                                                           in_stack_ffffffffffffeae0));
                                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)CONCAT17(in_stack_ffffffffffffeabf,
                                                           in_stack_ffffffffffffeab8),
                                               (char *)in_stack_ffffffffffffeab0);
                                Lib::UserErrorException::Exception
                                          (in_stack_ffffffffffffeab0,
                                           (string *)
                                           CONCAT44(in_stack_ffffffffffffeaac,
                                                    in_stack_ffffffffffffeaa8));
                                local_c61 = 0;
                                __cxa_throw(uVar6,&Lib::UserErrorException::typeinfo,
                                            Lib::UserErrorException::~UserErrorException);
                              }
                              local_c70 = Shell::LispListReader::readNext
                                                    ((LispListReader *)0xa4a400);
                              readAssertNot(in_stack_ffffffffffffec80,
                                            (LExpr *)CONCAT17(in_stack_ffffffffffffec7f,
                                                              in_stack_ffffffffffffec78));
                              Shell::LispListReader::acceptEOL
                                        ((LispListReader *)
                                         CONCAT17(in_stack_ffffffffffffeaf7,
                                                  in_stack_ffffffffffffeaf0));
                            }
                            else {
                              in_stack_ffffffffffffeba0 = (LExprList *)local_c91;
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)CONCAT17(in_stack_ffffffffffffeaf7,
                                                     in_stack_ffffffffffffeaf0),
                                         (char *)in_stack_ffffffffffffeae8,
                                         (allocator<char> *)
                                         CONCAT17(in_stack_ffffffffffffeae7,
                                                  in_stack_ffffffffffffeae0));
                              in_stack_ffffffffffffeb9f =
                                   Shell::LispListReader::tryAcceptAtom
                                             ((LispListReader *)
                                              CONCAT17(in_stack_ffffffffffffeacf,
                                                       in_stack_ffffffffffffeac8),
                                              (string *)in_stack_ffffffffffffeac0);
                              std::__cxx11::string::~string((string *)(local_c91 + 1));
                              std::allocator<char>::~allocator((allocator<char> *)local_c91);
                              if ((in_stack_ffffffffffffeb9f & 1) == 0) {
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)CONCAT17(in_stack_ffffffffffffeaf7,
                                                       in_stack_ffffffffffffeaf0),
                                           (char *)in_stack_ffffffffffffeae8,
                                           (allocator<char> *)
                                           CONCAT17(in_stack_ffffffffffffeae7,
                                                    in_stack_ffffffffffffeae0));
                                bVar1 = Shell::LispListReader::tryAcceptAtom
                                                  ((LispListReader *)
                                                   CONCAT17(in_stack_ffffffffffffeacf,
                                                            in_stack_ffffffffffffeac8),
                                                   (string *)in_stack_ffffffffffffeac0);
                                std::__cxx11::string::~string(local_d70);
                                std::allocator<char>::~allocator(&local_d71);
                                if (bVar1) {
                                  Shell::LispListReader::readAtom_abi_cxx11_
                                            (in_stack_ffffffffffffeb08);
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)CONCAT17(in_stack_ffffffffffffeaf7,
                                                         in_stack_ffffffffffffeaf0),
                                             (char *)in_stack_ffffffffffffeae8,
                                             (allocator<char> *)
                                             CONCAT17(in_stack_ffffffffffffeae7,
                                                      in_stack_ffffffffffffeae0));
                                  bVar1 = Shell::LispListReader::tryAcceptAtom
                                                    ((LispListReader *)
                                                     CONCAT17(in_stack_ffffffffffffeacf,
                                                              in_stack_ffffffffffffeac8),
                                                     (string *)in_stack_ffffffffffffeac0);
                                  std::__cxx11::string::~string(local_db8);
                                  std::allocator<char>::~allocator(&local_db9);
                                  if (bVar1) {
                                    colorSymbol(in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8,
                                                (Color)((ulong)in_stack_ffffffffffffebe0 >> 0x20));
                                  }
                                  else {
                                    in_stack_ffffffffffffeb60 = (SMTLIB2 *)&local_de1;
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)CONCAT17(in_stack_ffffffffffffeaf7,
                                                           in_stack_ffffffffffffeaf0),
                                               (char *)in_stack_ffffffffffffeae8,
                                               (allocator<char> *)
                                               CONCAT17(in_stack_ffffffffffffeae7,
                                                        in_stack_ffffffffffffeae0));
                                    in_stack_ffffffffffffeb5f =
                                         Shell::LispListReader::tryAcceptAtom
                                                   ((LispListReader *)
                                                    CONCAT17(in_stack_ffffffffffffeacf,
                                                             in_stack_ffffffffffffeac8),
                                                    (string *)in_stack_ffffffffffffeac0);
                                    std::__cxx11::string::~string(local_de0);
                                    std::allocator<char>::~allocator(&local_de1);
                                    if ((in_stack_ffffffffffffeb5f & 1) == 0) {
                                      uVar6 = __cxa_allocate_exception(0x50);
                                      Shell::LispListReader::readAtom_abi_cxx11_
                                                (in_stack_ffffffffffffeb08);
                                      std::operator+((char *)CONCAT17(in_stack_ffffffffffffeabf,
                                                                      in_stack_ffffffffffffeab8),
                                                     (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffeab0);
                                      std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_ffffffffffffeabf,
                                                             in_stack_ffffffffffffeab8),
                                                  (char *)in_stack_ffffffffffffeab0);
                                      std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_ffffffffffffeabf,
                                                             in_stack_ffffffffffffeab8),
                                                  (char *)in_stack_ffffffffffffeab0);
                                      Shell::LispParser::Expression::toString_abi_cxx11_
                                                (in_stack_ffffffffffffeb18,
                                                 (bool)in_stack_ffffffffffffeb17);
                                      std::operator+(in_stack_ffffffffffffeae8,
                                                     (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_ffffffffffffeae7,
                                                             in_stack_ffffffffffffeae0));
                                      std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_ffffffffffffeabf,
                                                             in_stack_ffffffffffffeab8),
                                                  (char *)in_stack_ffffffffffffeab0);
                                      Lib::UserErrorException::Exception
                                                (in_stack_ffffffffffffeab0,
                                                 (string *)
                                                 CONCAT44(in_stack_ffffffffffffeaac,
                                                          in_stack_ffffffffffffeaa8));
                                      __cxa_throw(uVar6,&Lib::UserErrorException::typeinfo,
                                                  Lib::UserErrorException::~UserErrorException);
                                    }
                                    colorSymbol(in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8,
                                                (Color)((ulong)in_stack_ffffffffffffebe0 >> 0x20));
                                  }
                                  Shell::LispListReader::acceptEOL
                                            ((LispListReader *)
                                             CONCAT17(in_stack_ffffffffffffeaf7,
                                                      in_stack_ffffffffffffeaf0));
                                  std::__cxx11::string::~string(local_d98);
                                }
                                else {
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)CONCAT17(in_stack_ffffffffffffeaf7,
                                                         in_stack_ffffffffffffeaf0),
                                             (char *)in_stack_ffffffffffffeae8,
                                             (allocator<char> *)
                                             CONCAT17(in_stack_ffffffffffffeae7,
                                                      in_stack_ffffffffffffeae0));
                                  bVar1 = Shell::LispListReader::tryAcceptAtom
                                                    ((LispListReader *)
                                                     CONCAT17(in_stack_ffffffffffffeacf,
                                                              in_stack_ffffffffffffeac8),
                                                     (string *)in_stack_ffffffffffffeac0);
                                  std::__cxx11::string::~string(local_ef0);
                                  std::allocator<char>::~allocator(&local_ef1);
                                  if (bVar1) {
                                    Shell::LispListReader::acceptEOL
                                              ((LispListReader *)
                                               CONCAT17(in_stack_ffffffffffffeaf7,
                                                        in_stack_ffffffffffffeaf0));
                                    local_19 = 1;
                                    goto LAB_00a4b480;
                                  }
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)CONCAT17(in_stack_ffffffffffffeaf7,
                                                         in_stack_ffffffffffffeaf0),
                                             (char *)in_stack_ffffffffffffeae8,
                                             (allocator<char> *)
                                             CONCAT17(in_stack_ffffffffffffeae7,
                                                      in_stack_ffffffffffffeae0));
                                  bVar1 = Shell::LispListReader::tryAcceptAtom
                                                    ((LispListReader *)
                                                     CONCAT17(in_stack_ffffffffffffeacf,
                                                              in_stack_ffffffffffffeac8),
                                                     (string *)in_stack_ffffffffffffeac0);
                                  std::__cxx11::string::~string((string *)&stack0xfffffffffffff0e8);
                                  std::allocator<char>::~allocator
                                            ((allocator<char> *)&stack0xfffffffffffff0e7);
                                  if (bVar1) {
                                    Shell::LispListReader::acceptEOL
                                              ((LispListReader *)
                                               CONCAT17(in_stack_ffffffffffffeaf7,
                                                        in_stack_ffffffffffffeaf0));
                                    goto LAB_00a4b480;
                                  }
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)CONCAT17(in_stack_ffffffffffffeaf7,
                                                         in_stack_ffffffffffffeaf0),
                                             (char *)in_stack_ffffffffffffeae8,
                                             (allocator<char> *)
                                             CONCAT17(in_stack_ffffffffffffeae7,
                                                      in_stack_ffffffffffffeae0));
                                  bVar1 = Shell::LispListReader::tryAcceptAtom
                                                    ((LispListReader *)
                                                     CONCAT17(in_stack_ffffffffffffeacf,
                                                              in_stack_ffffffffffffeac8),
                                                     (string *)in_stack_ffffffffffffeac0);
                                  std::__cxx11::string::~string(local_f40);
                                  std::allocator<char>::~allocator(&local_f41);
                                  if (!bVar1) {
                                    in_stack_ffffffffffffeb18 = (Expression *)local_f69;
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)CONCAT17(in_stack_ffffffffffffeaf7,
                                                           in_stack_ffffffffffffeaf0),
                                               (char *)in_stack_ffffffffffffeae8,
                                               (allocator<char> *)
                                               CONCAT17(in_stack_ffffffffffffeae7,
                                                        in_stack_ffffffffffffeae0));
                                    in_stack_ffffffffffffeb17 =
                                         Shell::LispListReader::tryAcceptAtom
                                                   ((LispListReader *)
                                                    CONCAT17(in_stack_ffffffffffffeacf,
                                                             in_stack_ffffffffffffeac8),
                                                    (string *)in_stack_ffffffffffffeac0);
                                    std::__cxx11::string::~string((string *)(local_f69 + 1));
                                    std::allocator<char>::~allocator((allocator<char> *)local_f69);
                                    if ((in_stack_ffffffffffffeb17 & 1) == 0) {
                                      in_stack_ffffffffffffeaf8 = (LExpr *)local_fd9;
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_ffffffffffffeaf7,
                                                             in_stack_ffffffffffffeaf0),
                                                 (char *)in_stack_ffffffffffffeae8,
                                                 (allocator<char> *)
                                                 CONCAT17(in_stack_ffffffffffffeae7,
                                                          in_stack_ffffffffffffeae0));
                                      in_stack_ffffffffffffeaf7 =
                                           Shell::LispListReader::tryAcceptAtom
                                                     ((LispListReader *)
                                                      CONCAT17(in_stack_ffffffffffffeacf,
                                                               in_stack_ffffffffffffeac8),
                                                      (string *)in_stack_ffffffffffffeac0);
                                      std::__cxx11::string::~string((string *)(local_fd9 + 1));
                                      std::allocator<char>::~allocator((allocator<char> *)local_fd9)
                                      ;
                                      if ((in_stack_ffffffffffffeaf7 & 1) == 0) {
                                        in_stack_ffffffffffffeae8 =
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_1001;
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_ffffffffffffeaf7,
                                                             in_stack_ffffffffffffeaf0),
                                                  (char *)in_stack_ffffffffffffeae8,
                                                  (allocator<char> *)
                                                  CONCAT17(in_stack_ffffffffffffeae7,
                                                           in_stack_ffffffffffffeae0));
                                        in_stack_ffffffffffffeae7 =
                                             Shell::LispListReader::tryAcceptAtom
                                                       ((LispListReader *)
                                                        CONCAT17(in_stack_ffffffffffffeacf,
                                                                 in_stack_ffffffffffffeac8),
                                                        (string *)in_stack_ffffffffffffeac0);
                                        std::__cxx11::string::~string((string *)(local_1001 + 1));
                                        std::allocator<char>::~allocator
                                                  ((allocator<char> *)local_1001);
                                        if ((in_stack_ffffffffffffeae7 & 1) == 0) {
                                          local_10c9 = 1;
                                          uVar6 = __cxa_allocate_exception(0x50);
                                          Shell::LispListReader::readAtom_abi_cxx11_
                                                    (in_stack_ffffffffffffeb08);
                                          std::operator+((char *)CONCAT17(in_stack_ffffffffffffeabf,
                                                                          in_stack_ffffffffffffeab8)
                                                         ,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffeab0);
                                          std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_ffffffffffffeabf,
                                                             in_stack_ffffffffffffeab8),
                                                  (char *)in_stack_ffffffffffffeab0);
                                          Shell::LispParser::Expression::toString_abi_cxx11_
                                                    (in_stack_ffffffffffffeb18,
                                                     (bool)in_stack_ffffffffffffeb17);
                                          std::operator+(in_stack_ffffffffffffeae8,
                                                         (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_ffffffffffffeae7,
                                                             in_stack_ffffffffffffeae0));
                                          std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_ffffffffffffeabf,
                                                             in_stack_ffffffffffffeab8),
                                                  (char *)in_stack_ffffffffffffeab0);
                                          Lib::UserErrorException::Exception
                                                    (in_stack_ffffffffffffeab0,
                                                     (string *)
                                                     CONCAT44(in_stack_ffffffffffffeaac,
                                                              in_stack_ffffffffffffeaa8));
                                          local_10c9 = 0;
                                          __cxa_throw(uVar6,&Lib::UserErrorException::typeinfo,
                                                      Lib::UserErrorException::~UserErrorException);
                                        }
                                      }
                                    }
                                    else {
                                      in_stack_ffffffffffffeb08 = (LispListReader *)&local_f91;
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_ffffffffffffeaf7,
                                                             in_stack_ffffffffffffeaf0),
                                                 (char *)in_stack_ffffffffffffeae8,
                                                 (allocator<char> *)
                                                 CONCAT17(in_stack_ffffffffffffeae7,
                                                          in_stack_ffffffffffffeae0));
                                      in_stack_ffffffffffffeb07 =
                                           Shell::LispListReader::tryAcceptAtom
                                                     ((LispListReader *)
                                                      CONCAT17(in_stack_ffffffffffffeacf,
                                                               in_stack_ffffffffffffeac8),
                                                      (string *)in_stack_ffffffffffffeac0);
                                      std::__cxx11::string::~string
                                                ((string *)((long)&local_f91 + 1));
                                      std::allocator<char>::~allocator
                                                ((allocator<char> *)&local_f91);
                                      if ((in_stack_ffffffffffffeb07 & 1) != 0) {
                                        local_fa0 = Shell::LispListReader::readList
                                                              ((LispListReader *)0xa4afe3);
                                        Lib::List<Shell::LispParser::Expression_*>::Iterator::
                                        Iterator(&local_fa8,local_fa0);
                                        while (bVar1 = Lib::List<Shell::LispParser::Expression_*>::
                                                       Iterator::hasNext((Iterator *)0xa4b00d),
                                              bVar1) {
                                          local_fb0 = Lib::List<Shell::LispParser::Expression_*>::
                                                      Iterator::next((Iterator *)
                                                                     in_stack_ffffffffffffeab0);
                                          local_fb8 = &local_fb0->str;
                                          markSymbolUncomputable
                                                    (in_stack_ffffffffffffeb60,
                                                     (string *)
                                                     CONCAT17(in_stack_ffffffffffffeb5f,
                                                              in_stack_ffffffffffffeb58));
                                        }
                                        Shell::LispListReader::acceptEOL
                                                  ((LispListReader *)
                                                   CONCAT17(in_stack_ffffffffffffeaf7,
                                                            in_stack_ffffffffffffeaf0));
                                      }
                                    }
                                  }
                                }
                              }
                              else {
                                bVar1 = Shell::LispListReader::hasNext((LispListReader *)0xa4a4b7);
                                if (!bVar1) {
                                  local_d41 = 1;
                                  uVar6 = __cxa_allocate_exception(0x50);
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)CONCAT17(in_stack_ffffffffffffeaf7,
                                                         in_stack_ffffffffffffeaf0),
                                             (char *)in_stack_ffffffffffffeae8,
                                             (allocator<char> *)
                                             CONCAT17(in_stack_ffffffffffffeae7,
                                                      in_stack_ffffffffffffeae0));
                                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_ffffffffffffeabf,
                                                             in_stack_ffffffffffffeab8),
                                                 (char *)in_stack_ffffffffffffeab0);
                                  Shell::LispParser::Expression::toString_abi_cxx11_
                                            (in_stack_ffffffffffffeb18,
                                             (bool)in_stack_ffffffffffffeb17);
                                  std::operator+(in_stack_ffffffffffffeae8,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_ffffffffffffeae7,
                                                             in_stack_ffffffffffffeae0));
                                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_ffffffffffffeabf,
                                                             in_stack_ffffffffffffeab8),
                                                 (char *)in_stack_ffffffffffffeab0);
                                  Lib::UserErrorException::Exception
                                            (in_stack_ffffffffffffeab0,
                                             (string *)
                                             CONCAT44(in_stack_ffffffffffffeaac,
                                                      in_stack_ffffffffffffeaa8));
                                  local_d41 = 0;
                                  __cxa_throw(uVar6,&Lib::UserErrorException::typeinfo,
                                              Lib::UserErrorException::~UserErrorException);
                                }
                                local_d50 = Shell::LispListReader::readNext
                                                      ((LispListReader *)0xa4a713);
                                readAssertTheory(in_stack_ffffffffffffec30,in_stack_ffffffffffffec28
                                                );
                                Shell::LispListReader::acceptEOL
                                          ((LispListReader *)
                                           CONCAT17(in_stack_ffffffffffffeaf7,
                                                    in_stack_ffffffffffffeaf0));
                              }
                            }
                          }
                          else {
                            bVar1 = Shell::LispListReader::hasNext((LispListReader *)0xa49e91);
                            if (!bVar1) {
                              local_b81 = 1;
                              uVar6 = __cxa_allocate_exception(0x50);
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)CONCAT17(in_stack_ffffffffffffeaf7,
                                                     in_stack_ffffffffffffeaf0),
                                         (char *)in_stack_ffffffffffffeae8,
                                         (allocator<char> *)
                                         CONCAT17(in_stack_ffffffffffffeae7,
                                                  in_stack_ffffffffffffeae0));
                              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)CONCAT17(in_stack_ffffffffffffeabf,
                                                         in_stack_ffffffffffffeab8),
                                             (char *)in_stack_ffffffffffffeab0);
                              Shell::LispParser::Expression::toString_abi_cxx11_
                                        (in_stack_ffffffffffffeb18,(bool)in_stack_ffffffffffffeb17);
                              std::operator+(in_stack_ffffffffffffeae8,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)CONCAT17(in_stack_ffffffffffffeae7,
                                                         in_stack_ffffffffffffeae0));
                              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)CONCAT17(in_stack_ffffffffffffeabf,
                                                         in_stack_ffffffffffffeab8),
                                             (char *)in_stack_ffffffffffffeab0);
                              Lib::UserErrorException::Exception
                                        (in_stack_ffffffffffffeab0,
                                         (string *)
                                         CONCAT44(in_stack_ffffffffffffeaac,
                                                  in_stack_ffffffffffffeaa8));
                              local_b81 = 0;
                              __cxa_throw(uVar6,&Lib::UserErrorException::typeinfo,
                                          Lib::UserErrorException::~UserErrorException);
                            }
                            local_b90 = Shell::LispListReader::readNext((LispListReader *)0xa4a0ed);
                            readAssertClaim(in_stack_ffffffffffffec90,
                                            (LExpr *)CONCAT17(in_stack_ffffffffffffec8f,
                                                              in_stack_ffffffffffffec88));
                            Shell::LispListReader::acceptEOL
                                      ((LispListReader *)
                                       CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0)
                                      );
                          }
                        }
                      }
                    }
                    else {
                      Shell::LispListReader::readAtom_abi_cxx11_(in_stack_ffffffffffffeb08);
                      local_7d8 = Shell::LispListReader::readList((LispListReader *)0xa4918e);
                      Shell::LispListReader::LispListReader
                                ((LispListReader *)in_stack_ffffffffffffeab0,
                                 (LExprList *)
                                 CONCAT44(in_stack_ffffffffffffeaac,in_stack_ffffffffffffeaa8));
                      in_stack_ffffffffffffec90 =
                           (SMTLIB2 *)
                           Lib::
                           DHMap<std::__cxx11::string,std::pair<Kernel::TermList,Kernel::TermList>,Lib::DefaultHash,Lib::DefaultHash2>
                           ::operator_new(0xa491c9);
                      Lib::
                      DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
                      ::DHMap((DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
                               *)in_stack_ffffffffffffec90);
                      local_7e8 = in_stack_ffffffffffffec90;
                      Lib::Stack<Kernel::TermList>::Stack
                                (in_stack_ffffffffffffeac0,
                                 CONCAT17(in_stack_ffffffffffffeabf,in_stack_ffffffffffffeab8));
                      Lib::
                      Stack<Lib::DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>_*>
                      ::push((Stack<Lib::DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>_*>
                              *)in_stack_ffffffffffffeab0,
                             (DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
                              *)CONCAT44(in_stack_ffffffffffffeaac,in_stack_ffffffffffffeaa8));
                      in_stack_ffffffffffffec8f =
                           Shell::LispListReader::hasNext((LispListReader *)0xa49230);
                      if ((bool)in_stack_ffffffffffffec8f) {
                        in_stack_ffffffffffffec80 =
                             (SMTLIB2 *)
                             Shell::LispListReader::peekAtNext((LispListReader *)0xa49256);
                        in_stack_ffffffffffffec7f =
                             Shell::LispParser::Expression::isAtom
                                       ((Expression *)in_stack_ffffffffffffec80);
                        if ((bool)in_stack_ffffffffffffec7f) {
                          Shell::LispListReader::peekAtNext((LispListReader *)0xa49293);
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffeab0,
                                                  (char *)CONCAT44(in_stack_ffffffffffffeaac,
                                                                   in_stack_ffffffffffffeaa8));
                          if (bVar1) {
                            Shell::LispListReader::acceptEOL
                                      ((LispListReader *)
                                       CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0)
                                      );
                            Shell::LispListReader::readAtom_abi_cxx11_(in_stack_ffffffffffffeb08);
                            std::__cxx11::string::~string(local_828);
                            readTypeParameters(in_stack_ffffffffffffee80,
                                               (LispListReader *)
                                               CONCAT17(in_stack_ffffffffffffee7f,
                                                        in_stack_ffffffffffffee78),lookup_00,
                                               (TermStack *)
                                               CONCAT17(bVar2,CONCAT16(in_stack_ffffffffffffee6e,
                                                                       in_stack_ffffffffffffee68)));
                            local_7d8 = Shell::LispListReader::readList((LispListReader *)0xa49335);
                            local_30 = local_7e0;
                          }
                        }
                      }
                      bVar1 = Shell::LispListReader::hasNext((LispListReader *)0xa4947c);
                      if (!bVar1) {
                        local_8d1 = 1;
                        uVar6 = __cxa_allocate_exception(0x50);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0),
                                   (char *)in_stack_ffffffffffffeae8,
                                   (allocator<char> *)
                                   CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0));
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT17(in_stack_ffffffffffffeabf,
                                                   in_stack_ffffffffffffeab8),
                                       (char *)in_stack_ffffffffffffeab0);
                        Shell::LispParser::Expression::toString_abi_cxx11_
                                  (in_stack_ffffffffffffeb18,(bool)in_stack_ffffffffffffeb17);
                        std::operator+(in_stack_ffffffffffffeae8,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT17(in_stack_ffffffffffffeae7,
                                                   in_stack_ffffffffffffeae0));
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT17(in_stack_ffffffffffffeabf,
                                                   in_stack_ffffffffffffeab8),
                                       (char *)in_stack_ffffffffffffeab0);
                        Lib::UserErrorException::Exception
                                  (in_stack_ffffffffffffeab0,
                                   (string *)
                                   CONCAT44(in_stack_ffffffffffffeaac,in_stack_ffffffffffffeaa8));
                        local_8d1 = 0;
                        __cxa_throw(uVar6,&Lib::UserErrorException::typeinfo,
                                    Lib::UserErrorException::~UserErrorException);
                      }
                      local_8e0 = Shell::LispListReader::readNext((LispListReader *)0xa496a1);
                      bVar1 = Shell::LispListReader::hasNext((LispListReader *)0xa496c8);
                      if (!bVar1) {
                        local_989 = 1;
                        uVar6 = __cxa_allocate_exception(0x50);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0),
                                   (char *)in_stack_ffffffffffffeae8,
                                   (allocator<char> *)
                                   CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0));
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT17(in_stack_ffffffffffffeabf,
                                                   in_stack_ffffffffffffeab8),
                                       (char *)in_stack_ffffffffffffeab0);
                        Shell::LispParser::Expression::toString_abi_cxx11_
                                  (in_stack_ffffffffffffeb18,(bool)in_stack_ffffffffffffeb17);
                        std::operator+(in_stack_ffffffffffffeae8,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT17(in_stack_ffffffffffffeae7,
                                                   in_stack_ffffffffffffeae0));
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT17(in_stack_ffffffffffffeabf,
                                                   in_stack_ffffffffffffeab8),
                                       (char *)in_stack_ffffffffffffeab0);
                        Lib::UserErrorException::Exception
                                  (in_stack_ffffffffffffeab0,
                                   (string *)
                                   CONCAT44(in_stack_ffffffffffffeaac,in_stack_ffffffffffffeaa8));
                        local_989 = 0;
                        __cxa_throw(uVar6,&Lib::UserErrorException::typeinfo,
                                    Lib::UserErrorException::~UserErrorException);
                      }
                      local_998 = Shell::LispListReader::readNext((LispListReader *)0xa498ed);
                      in_stack_ffffffffffffeaa8 = local_759 & 1;
                      readDefineFun(in_stack_fffffffffffff100,in_stack_fffffffffffff0f8,
                                    in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8,
                                    in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8,
                                    (bool)in_stack_fffffffffffff0d7);
                      Shell::LispListReader::acceptEOL
                                ((LispListReader *)
                                 CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
                      pDVar5 = Lib::
                               Stack<Lib::DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>_*>
                               ::pop((Stack<Lib::DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>_*>
                                      *)(in_RDI + 0xa8));
                      if (pDVar5 != (DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
                                     *)0x0) {
                        Lib::
                        DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
                        ::~DHMap((DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
                                  *)in_stack_ffffffffffffeab0);
                        Lib::
                        DHMap<std::__cxx11::string,std::pair<Kernel::TermList,Kernel::TermList>,Lib::DefaultHash,Lib::DefaultHash2>
                        ::operator_delete(in_stack_ffffffffffffeab0,
                                          CONCAT44(in_stack_ffffffffffffeaac,
                                                   in_stack_ffffffffffffeaa8));
                      }
                      Lib::Stack<Kernel::TermList>::~Stack
                                ((Stack<Kernel::TermList> *)in_stack_ffffffffffffeab0);
                      std::__cxx11::string::~string(local_7d0);
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        Shell::LispListReader::readAtom_abi_cxx11_(in_stack_ffffffffffffeb08);
        std::__cxx11::string::string(local_298);
        in_stack_ffffffffffffee6e =
             Shell::LispListReader::tryReadAtom
                       ((LispListReader *)
                        CONCAT17(in_stack_ffffffffffffeabf,in_stack_ffffffffffffeab8),
                        (string *)in_stack_ffffffffffffeab0);
        if (!(bool)in_stack_ffffffffffffee6e) {
          local_339 = 1;
          uVar6 = __cxa_allocate_exception(0x50);
          std::operator+((char *)in_stack_ffffffffffffeaf8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_ffffffffffffeabf,in_stack_ffffffffffffeab8),
                         (char *)in_stack_ffffffffffffeab0);
          Shell::LispParser::Expression::toString_abi_cxx11_
                    (in_stack_ffffffffffffeb18,(bool)in_stack_ffffffffffffeb17);
          std::operator+(in_stack_ffffffffffffeae8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_ffffffffffffeabf,in_stack_ffffffffffffeab8),
                         (char *)in_stack_ffffffffffffeab0);
          Lib::UserErrorException::Exception
                    (in_stack_ffffffffffffeab0,
                     (string *)CONCAT44(in_stack_ffffffffffffeaac,in_stack_ffffffffffffeaa8));
          local_339 = 0;
          __cxa_throw(uVar6,&Lib::UserErrorException::typeinfo,
                      Lib::UserErrorException::~UserErrorException);
        }
        readDeclareSort((SMTLIB2 *)CONCAT44(in_stack_ffffffffffffed94,in_stack_ffffffffffffed90),
                        (string *)in_stack_ffffffffffffed88,in_stack_ffffffffffffed80);
        Shell::LispListReader::acceptEOL
                  ((LispListReader *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
        std::__cxx11::string::~string(local_298);
        std::__cxx11::string::~string(local_278);
      }
    }
  } while( true );
}

Assistant:

void SMTLIB2::readBenchmark(LExprList* bench)
{
  LispListReader bRdr(bench);

  bool afterCheckSat = false;

  // iteration over benchmark top level entries
  while(bRdr.hasNext()) {
    LExpr* lexp = bRdr.next();
    _topLevelExpr = lexp;
    _nextVar = 0;

    LOG2("readBenchmark ",lexp->toString(true));

    LispListReader ibRdr(lexp);

    if (ibRdr.tryAcceptAtom("set-logic")) {
      if (_logicSet) {
        USER_ERROR_EXPR("set-logic can appear only once in a problem");
      }
      readLogic(ibRdr.readAtom());
      ibRdr.acceptEOL();
      continue;
    }

    if (ibRdr.tryAcceptAtom("set-info")) {

      if (ibRdr.tryAcceptAtom(":status")) {
        _statusStr = ibRdr.readAtom();
        ibRdr.acceptEOL();
        continue;
      }

      if (ibRdr.tryAcceptAtom(":source")) {
        _sourceInfo = ibRdr.readAtom();
        ibRdr.acceptEOL();
        continue;
      }

      // ignore unknown info
      ibRdr.readAtom();
      ibRdr.readAtom();
      ibRdr.acceptEOL();
      continue;
    }

    if (ibRdr.tryAcceptAtom("declare-sort")) {
      std::string name = ibRdr.readAtom();
      std::string arity;
      if (!ibRdr.tryReadAtom(arity)) {
        USER_ERROR_EXPR("Unspecified arity while declaring sort: "+name);
      }

      readDeclareSort(name,arity);

      ibRdr.acceptEOL();

      continue;
    }

    if (ibRdr.tryAcceptAtom("define-sort")) {
      std::string name = ibRdr.readAtom();
      LExprList* args = ibRdr.readList();

      if (!ibRdr.hasNext()) {
        USER_ERROR_EXPR("define-sort expects a sort definition body");
      }
      LExpr* body = ibRdr.readNext();

      readDefineSort(name,args,body);

      ibRdr.acceptEOL();

      continue;
    }

    if (ibRdr.tryAcceptAtom("declare-fun")) {
      std::string name = ibRdr.readAtom();
      LExprList* iSorts = ibRdr.readList();
      LispListReader iSortRdr(iSorts);
      auto lookup = new TermLookup();
      _scopes.push(lookup);
      if (iSortRdr.hasNext() && iSortRdr.peekAtNext()->isAtom() && iSortRdr.peekAtNext()->str == PAR) {
        ibRdr.acceptEOL();
        iSortRdr.readAtom(); // the "par" atom
        readTypeParameters(iSortRdr, lookup);
        iSorts = iSortRdr.readList();
        ibRdr = iSortRdr;
      }
      if (!ibRdr.hasNext()) {
        USER_ERROR_EXPR("declare-fun expects an output sort");
      }
      LExpr* oSort = ibRdr.readNext();

      readDeclareFun(name,iSorts,oSort,lookup->size());

      ibRdr.acceptEOL();
      delete _scopes.pop();

      continue;
    }

    if (ibRdr.tryAcceptAtom("declare-datatype")) {
      LExpr *sort = ibRdr.readNext();
      LExprList *datatype = ibRdr.readList();

      readDeclareDatatype(sort, datatype);

      ibRdr.acceptEOL();

      continue;
    }

    if (ibRdr.tryAcceptAtom("declare-datatypes")) {
      LExprList* sorts = ibRdr.readList();
      LExprList* datatypes = ibRdr.readList();

      readDeclareDatatypes(sorts, datatypes, false);

      ibRdr.acceptEOL();

      continue;
    }

    if (ibRdr.tryAcceptAtom("declare-codatatypes")) {
      LExprList* sorts = ibRdr.readList();
      LExprList* datatypes = ibRdr.readList();

      readDeclareDatatypes(sorts, datatypes, true);

      ibRdr.acceptEOL();

      continue;
    }
    
    if (ibRdr.tryAcceptAtom("declare-const")) {
      std::string name = ibRdr.readAtom();
      if (!ibRdr.hasNext()) {
        USER_ERROR_EXPR("declare-const expects a const definition body");
      }
      LExpr* oSort = ibRdr.readNext();
      auto lookup = new TermLookup();
      _scopes.push(lookup);
      if (oSort->isList()) {
        LispListReader oSortRdr(oSort);
        if (oSortRdr.hasNext() && oSortRdr.peekAtNext()->isAtom() && oSortRdr.peekAtNext()->str == PAR) {
          ibRdr.acceptEOL();
          oSortRdr.readAtom(); // the "par" atom
          readTypeParameters(oSortRdr, lookup);
          oSort = oSortRdr.readNext();
          ibRdr = oSortRdr;
        }
      }

      readDeclareFun(name,nullptr,oSort,lookup->size());

      ibRdr.acceptEOL();
      delete _scopes.pop();

      continue;
    }

    bool recursive = false;
    if (ibRdr.tryAcceptAtom("define-fun") || (recursive = ibRdr.tryAcceptAtom("define-fun-rec"))) {
      std::string name = ibRdr.readAtom();
      LExprList* iArgs = ibRdr.readList();
      LispListReader iArgRdr(iArgs);
      auto lookup = new TermLookup();
      TermStack typeArgs;
      _scopes.push(lookup);
      if (iArgRdr.hasNext() && iArgRdr.peekAtNext()->isAtom() && iArgRdr.peekAtNext()->str == PAR) {
        ibRdr.acceptEOL();
        iArgRdr.readAtom(); // the "par" atom
        readTypeParameters(iArgRdr, lookup, &typeArgs);
        iArgs = iArgRdr.readList();
        ibRdr = iArgRdr;
      }
      if (!ibRdr.hasNext()) {
        USER_ERROR_EXPR("define-fun expects an output sort");
      }
      LExpr* oSort = ibRdr.readNext();
      if (!ibRdr.hasNext()) {
        USER_ERROR_EXPR("define-fun expects a fun definition body");
      }
      LExpr* body = ibRdr.readNext();

      readDefineFun(name,iArgs,oSort,body,typeArgs,recursive);

      ibRdr.acceptEOL();
      delete _scopes.pop();

      continue;
    }

    if (ibRdr.tryAcceptAtom("define-funs-rec")) {
      LExprList* declarations = ibRdr.readList();
      LExprList* definitions = ibRdr.readList();

      readDefineFunsRec(declarations, definitions);

      continue;
    }

    if (ibRdr.tryAcceptAtom("assert")) {
      if (!ibRdr.hasNext()) {
        USER_ERROR_EXPR("assert expects a body");
      }
      LExpr* body = ibRdr.readNext();
      readAssert(body);

      ibRdr.acceptEOL();

      continue;
    }

    if (ibRdr.tryAcceptAtom("assert-claim")) {
      if (!ibRdr.hasNext()) {
        USER_ERROR_EXPR("assert expects a body");
      }
      LExpr* body = ibRdr.readNext();
      readAssertClaim(body);

      ibRdr.acceptEOL();

      continue;
    }

    if (ibRdr.tryAcceptAtom("assert-not")) {
      if (!ibRdr.hasNext()) {
        USER_ERROR_EXPR("assert-not expects a body");
      }
      LExpr* body = ibRdr.readNext();
      readAssertNot(body);

      ibRdr.acceptEOL();

      continue;
    }

    if (ibRdr.tryAcceptAtom("assert-theory")) {
      if (!ibRdr.hasNext()) {
        USER_ERROR_EXPR("assert-theory expects a body");
      }
      LExpr* body = ibRdr.readNext();
      readAssertTheory(body);

      ibRdr.acceptEOL();

      continue;
    }

    // not an official SMTLIB command
    if (ibRdr.tryAcceptAtom("color-symbol")) {
      std::string symbol = ibRdr.readAtom();

      if (ibRdr.tryAcceptAtom(":left")) {
        colorSymbol(symbol, Color::COLOR_LEFT);
      } else if (ibRdr.tryAcceptAtom(":right")) {
        colorSymbol(symbol, Color::COLOR_RIGHT);
      } else {
        USER_ERROR_EXPR("'"+ibRdr.readAtom()+"' is not a color keyword");
      }

      ibRdr.acceptEOL();

      continue;
    }

    if (ibRdr.tryAcceptAtom("check-sat")) {
      ibRdr.acceptEOL();
      afterCheckSat = true;
      break;
    }

    if (ibRdr.tryAcceptAtom("exit")) {
      bRdr.acceptEOL();
      break;
    }

    if (ibRdr.tryAcceptAtom("reset")) {
      LOG1("ignoring reset");
      continue;
    }

    if (ibRdr.tryAcceptAtom("set-option")) {
      if (ibRdr.tryAcceptAtom(":uncomputable")) {
        LExprList* lel = ibRdr.readList();
        LExprList::Iterator lIt(lel);
        while (lIt.hasNext()) {
          LExpr* exp = lIt.next();
          ASS(exp->isAtom());
          std::string& name = exp->str;
          markSymbolUncomputable(name);
        }
        ibRdr.acceptEOL();
        continue;
      }
      LOG2("ignoring set-option", ibRdr.readAtom());
      continue;
    }

    if (ibRdr.tryAcceptAtom("push")) {
      LOG1("ignoring push");
      continue;
    }

    if (ibRdr.tryAcceptAtom("get-info")) {
      LOG2("ignoring get-info", ibRdr.readAtom());
      continue;
    }

    USER_ERROR_EXPR("unrecognized entry "+ibRdr.readAtom());
  }
  
  // the above while loop is aborted on the first check-sat,
  // however, we want to learn about an unsat core printing request
  // (or other things we might support in the future)
  if (afterCheckSat) {
    while(bRdr.hasNext()) {
      LispListReader ibRdr(bRdr.next());
      
      if (ibRdr.tryAcceptAtom("exit")) {
        ibRdr.acceptEOL(); // no arguments of exit
        bRdr.acceptEOL();  // exit should be the last thing in the file
        break;
      }
      
      if (ibRdr.tryAcceptAtom("get-unsat-core")) {
        env.options->setOutputMode(Options::Output::UCORE);
        ibRdr.acceptEOL(); // no arguments of get-unsat-core
        continue;
      }
      
      // can't read anything else (and it does not make sense to read get-unsat-core more than once)
      // so let's just warn and exit
      if(env.options->mode()!=Options::Mode::SPIDER) {
        std::cout << "% Warning: check-sat is not the last entry. Skipping the rest!" << endl;
      }
      break;
    }
  }
}